

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

bool CaseInsensitiveEqual(string *s1,string *s2)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  const_reference pvVar4;
  long in_FS_OFFSET;
  char c2;
  char c1;
  size_t i;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  ulong __pos;
  undefined1 local_2a;
  undefined1 local_29;
  undefined8 local_28;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (this == pbVar2) {
    local_28 = 0;
    while( true ) {
      __pos = local_28;
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      if (sVar3 <= __pos) break;
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](this,__pos);
      local_29 = *pvVar4;
      if (('@' < local_29) && (local_29 < '[')) {
        local_29 = local_29 + ' ';
      }
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](this,__pos);
      local_2a = *pvVar4;
      if (('@' < local_2a) && (local_2a < '[')) {
        local_2a = local_2a + ' ';
      }
      if (local_29 != local_2a) {
        local_9 = false;
        goto LAB_00ebe6a7;
      }
      local_28 = local_28 + 1;
    }
    local_9 = true;
  }
  else {
    local_9 = false;
  }
LAB_00ebe6a7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool CaseInsensitiveEqual(const std::string& s1, const std::string& s2)
{
    if (s1.size() != s2.size()) return false;
    for (size_t i = 0; i < s1.size(); ++i) {
        char c1 = s1[i];
        if (c1 >= 'A' && c1 <= 'Z') c1 -= ('A' - 'a');
        char c2 = s2[i];
        if (c2 >= 'A' && c2 <= 'Z') c2 -= ('A' - 'a');
        if (c1 != c2) return false;
    }
    return true;
}